

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotriangle.cpp
# Opt level: O1

void pzgeom::TPZGeoTriangle::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  TPZGeoNode *this;
  long lVar4;
  long lVar5;
  int i_1;
  int64_t index;
  TPZManVector<long,_3> nodeindexes;
  TPZManVector<double,_3> co;
  TPZManVector<double,_3> scale;
  TPZManVector<double,_3> shift;
  double local_120;
  TPZVec<long> local_118;
  long local_f8 [3];
  double local_e0;
  TPZManVector<double,_3> local_d8;
  TPZManVector<double,_3> local_a0;
  TPZManVector<double,_3> local_68;
  
  TPZManVector<double,_3>::TPZManVector(&local_d8,3);
  TPZManVector<double,_3>::TPZManVector(&local_68,3);
  TPZManVector<double,_3>::TPZManVector(&local_a0,3);
  TPZVec<long>::TPZVec(&local_118,0);
  local_118.fStore = local_f8;
  local_118._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018a3008;
  local_118.fNElements = 3;
  local_118.fNAlloc = 0;
  pdVar1 = size->fStore;
  pdVar2 = lowercorner->fStore;
  lVar5 = 0;
  do {
    local_a0.super_TPZVec<double>.fStore[lVar5] = pdVar1[lVar5] / 3.0;
    local_68.super_TPZVec<double>.fStore[lVar5] = pdVar2[lVar5] + 0.5;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    pztopology::TPZTriangle::ParametricDomainNodeCoord((int)lVar5,&local_d8.super_TPZVec<double>);
    local_120 = 0.0;
    TPZManVector<double,_3>::Resize(&local_d8,3,&local_120);
    if (0 < local_d8.super_TPZVec<double>.fNElements) {
      lVar4 = 0;
      do {
        local_e0 = local_a0.super_TPZVec<double>.fStore[lVar4] *
                   local_d8.super_TPZVec<double>.fStore[lVar4] +
                   local_68.super_TPZVec<double>.fStore[lVar4];
        iVar3 = rand();
        local_d8.super_TPZVec<double>.fStore[lVar4] =
             ((double)iVar3 * 0.2) / 2147483647.0 + local_e0 + -0.1;
        lVar4 = lVar4 + 1;
      } while (lVar4 < local_d8.super_TPZVec<double>.fNElements);
    }
    iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    local_118.fStore[lVar5] = (long)iVar3;
    this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar3);
    TPZGeoNode::Initialize(this,&local_d8.super_TPZVec<double>,gmesh);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])
            (gmesh,2,&local_118,(ulong)(uint)matid,&local_120,1);
  if (local_118.fStore == local_f8) {
    local_118.fStore = (long *)0x0;
  }
  local_118.fNAlloc = 0;
  local_118._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  if (local_118.fStore != (long *)0x0) {
    operator_delete__(local_118.fStore);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_68);
  TPZManVector<double,_3>::~TPZManVector(&local_d8);
  return;
}

Assistant:

void TPZGeoTriangle::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        TPZManVector<REAL,3> co(3),shift(3),scale(3);
        TPZManVector<int64_t,3> nodeindexes(3);
        for (int i=0; i<3; i++) {
            scale[i] = size[i]/3.;
            shift[i] = 1./2.+lowercorner[i];
        }
        
        for (int i=0; i<NCornerNodes; i++) {
            ParametricDomainNodeCoord(i, co);
            co.Resize(3, 0.);
            for (int j=0; j<co.size(); j++) {
                co[j] = shift[j]+scale[j]*co[j]+(rand()*0.2/RAND_MAX)-0.1;
            }
            nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
            gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
        }
        int64_t index;
        gmesh.CreateGeoElement(ETriangle, nodeindexes, matid, index);
    }